

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

void uv__stream_connect(uv_stream_t *stream)

{
  socklen_t local_24;
  uv_connect_t *puStack_20;
  socklen_t errorsize;
  uv_connect_t *req;
  uv_stream_t *puStack_10;
  int error;
  uv_stream_t *stream_local;
  
  puStack_20 = stream->connect_req;
  local_24 = 4;
  puStack_10 = stream;
  if ((stream->type != UV_TCP) && (stream->type != UV_NAMED_PIPE)) {
    __assert_fail("stream->type == UV_TCP || stream->type == UV_NAMED_PIPE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x521,"void uv__stream_connect(uv_stream_t *)");
  }
  if (puStack_20 == (uv_connect_t *)0x0) {
    __assert_fail("req",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x522,"void uv__stream_connect(uv_stream_t *)");
  }
  if (stream->delayed_error == 0) {
    if ((stream->io_watcher).fd < 0) {
      __assert_fail("uv__stream_fd(stream) >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x52d,"void uv__stream_connect(uv_stream_t *)");
    }
    getsockopt((stream->io_watcher).fd,1,4,(void *)((long)&req + 4),&local_24);
    req._4_4_ = -req._4_4_;
  }
  else {
    req._4_4_ = stream->delayed_error;
    stream->delayed_error = 0;
  }
  if (req._4_4_ != -0x73) {
    puStack_10->connect_req = (uv_connect_t *)0x0;
    if ((puStack_10->loop->active_reqs).count == 0) {
      __assert_fail("uv__has_active_reqs(stream->loop)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x53a,"void uv__stream_connect(uv_stream_t *)");
    }
    (puStack_10->loop->active_reqs).count = (puStack_10->loop->active_reqs).count - 1;
    if ((req._4_4_ < 0) || (puStack_10->write_queue == (void **)puStack_10->write_queue[0])) {
      uv__io_stop(puStack_10->loop,&puStack_10->io_watcher,4);
    }
    if (puStack_20->cb != (uv_connect_cb)0x0) {
      (*puStack_20->cb)(puStack_20,req._4_4_);
    }
    if (((puStack_10->io_watcher).fd != -1) && (req._4_4_ < 0)) {
      uv__stream_flush_write_queue(puStack_10,-0x7d);
      uv__write_callbacks(puStack_10);
    }
  }
  return;
}

Assistant:

static void uv__stream_connect(uv_stream_t* stream) {
  int error;
  uv_connect_t* req = stream->connect_req;
  socklen_t errorsize = sizeof(int);

  assert(stream->type == UV_TCP || stream->type == UV_NAMED_PIPE);
  assert(req);

  if (stream->delayed_error) {
    /* To smooth over the differences between unixes errors that
     * were reported synchronously on the first connect can be delayed
     * until the next tick--which is now.
     */
    error = stream->delayed_error;
    stream->delayed_error = 0;
  } else {
    /* Normal situation: we need to get the socket error from the kernel. */
    assert(uv__stream_fd(stream) >= 0);
    getsockopt(uv__stream_fd(stream),
               SOL_SOCKET,
               SO_ERROR,
               &error,
               &errorsize);
    error = UV__ERR(error);
  }

  if (error == UV__ERR(EINPROGRESS))
    return;

  stream->connect_req = NULL;
  uv__req_unregister(stream->loop, req);

  if (error < 0 || QUEUE_EMPTY(&stream->write_queue)) {
    uv__io_stop(stream->loop, &stream->io_watcher, POLLOUT);
  }

  if (req->cb)
    req->cb(req, error);

  if (uv__stream_fd(stream) == -1)
    return;

  if (error < 0) {
    uv__stream_flush_write_queue(stream, UV_ECANCELED);
    uv__write_callbacks(stream);
  }
}